

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
MetaCommand::GetValueAsList
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,MetaCommand *this,string *optionName)

{
  __type _Var1;
  MetaCommand *this_00;
  Option local_a0;
  
  this_00 = (MetaCommand *)
            (this->m_OptionVector).
            super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (this_00 ==
        (MetaCommand *)
        (this->m_OptionVector).
        super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
      (__return_storage_ptr__->
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
      (__return_storage_ptr__->
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl._M_node._M_size = 0;
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    _Var1 = std::operator==(&this_00->m_Version,optionName);
    if (_Var1) break;
    this_00 = (MetaCommand *)&this_00->m_Author;
  }
  Option::Option(&local_a0,(Option *)this_00);
  GetValueAsList_abi_cxx11_(__return_storage_ptr__,this_00,&local_a0);
  Option::~Option(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

METAIO_STL::list< METAIO_STL::string > MetaCommand::
GetValueAsList( METAIO_STL::string optionName )
{
  OptionVector::const_iterator it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    if((*it).name == optionName)
      {
      return this->GetValueAsList( *it );
      }
    ++it;
    }
  METAIO_STL::list< METAIO_STL::string > empty;
  empty.clear();
  return empty;
}